

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O3

void __thiscall
QAbstractItemModel::beginInsertColumns
          (QAbstractItemModel *this,QModelIndex *parent,int first,int last)

{
  QAbstractItemModelPrivate *this_00;
  void **argv;
  long in_FS_OFFSET;
  int local_74;
  int local_70;
  undefined1 local_69;
  undefined8 local_68;
  QModelIndex *pQStack_60;
  QAbstractItemModel *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemModelPrivate **)(this + 8);
  local_58 = (parent->m).ptr;
  local_68._0_4_ = parent->r;
  local_68._4_4_ = parent->c;
  pQStack_60 = (QModelIndex *)parent->i;
  local_50 = (int *)CONCAT44(last,first);
  local_48 = (undefined1 *)((ulong)local_48 & 0xffffffffffffff00);
  QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::
  emplace<QAbstractItemModelPrivate::Change_const&>
            ((QMovableArrayOps<QAbstractItemModelPrivate::Change> *)&this_00->changes,
             (this_00->changes).super_QList<QAbstractItemModelPrivate::Change>.d.size,
             (Change *)&local_68);
  QList<QAbstractItemModelPrivate::Change>::end
            (&(this_00->changes).super_QList<QAbstractItemModelPrivate::Change>);
  local_58 = (QAbstractItemModel *)&local_70;
  local_50 = &local_74;
  local_68 = 0;
  local_48 = &local_69;
  argv = (void **)&local_68;
  local_74 = last;
  local_70 = first;
  pQStack_60 = parent;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0xd,argv);
  QAbstractItemModelPrivate::columnsAboutToBeInserted(this_00,parent,first,(int)argv);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::beginInsertColumns(const QModelIndex &parent, int first, int last)
{
    Q_ASSERT(first >= 0);
    Q_ASSERT(first <= columnCount(parent)); // == is allowed, to insert at the end
    Q_ASSERT(last >= first);
    Q_D(QAbstractItemModel);
    d->changes.push(QAbstractItemModelPrivate::Change(parent, first, last));
    emit columnsAboutToBeInserted(parent, first, last, QPrivateSignal());
    d->columnsAboutToBeInserted(parent, first, last);
}